

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::SingleVertexArrayFirstTests::init
          (SingleVertexArrayFirstTests *this,EVP_PKEY_CTX *ctx)

{
  int offset_;
  int t;
  GLValue min_;
  GLValue max_;
  int iVar1;
  int iVar2;
  MultiVertexArrayTest *this_00;
  long lVar3;
  long lVar4;
  InputType type;
  long lVar5;
  InputType type_00;
  long lVar6;
  long lVar7;
  bool bVar8;
  GLValue GVar9;
  GLValue GVar10;
  undefined4 uStack_254;
  undefined4 uStack_244;
  Spec spec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string name;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ArraySpec arraySpec;
  
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 4) {
            if (lVar5 == 0) {
              type_00 = (&DAT_005bd48c)[lVar3];
              iVar1 = deqp::gls::Array::inputTypeSize(type_00);
              iVar1 = iVar1 * 2;
            }
            else {
              iVar1 = (&DAT_005bd498)[lVar5];
              type_00 = (&DAT_005bd48c)[lVar3];
            }
            iVar2 = deqp::gls::Array::inputTypeSize(type_00);
            offset_ = (&DAT_005bd480)[lVar7];
            if (iVar1 % iVar2 == 0) {
              iVar2 = deqp::gls::Array::inputTypeSize(type_00);
              bVar8 = offset_ % iVar2 == 0;
            }
            else {
              bVar8 = false;
            }
            GVar9 = deqp::gls::GLValue::getMinValue(type_00);
            GVar10 = deqp::gls::GLValue::getMaxValue(type_00);
            max_._4_4_ = uStack_254;
            max_.type = GVar10.type;
            min_._4_4_ = uStack_244;
            min_.type = GVar9.type;
            min_.field_1 = GVar9.field_1;
            max_.field_1 = GVar10.field_1;
            deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                      (&arraySpec,type_00,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,2,
                       offset_,iVar1,false,min_,max_);
            spec.arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            spec.arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            spec.arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            spec.primitive = PRIMITIVE_TRIANGLES;
            iVar2 = *(int *)(&DAT_005bd468 + lVar4 * 4);
            t = *(int *)(&DAT_005bd470 + lVar6);
            spec.drawCount = iVar2;
            spec.first = t;
            std::
            vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ::push_back(&spec.arrays,&arraySpec);
            deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_170,(Array *)(ulong)type_00,type);
            std::operator+(&local_210,&local_170,"_first");
            typeToString<int>(&local_190,t);
            std::operator+(&local_150,&local_210,&local_190);
            std::operator+(&local_1f0,&local_150,"_offset");
            typeToString<int>(&local_b0,offset_);
            std::operator+(&local_90,&local_1f0,&local_b0);
            std::operator+(&local_1d0,&local_90,"_stride");
            typeToString<int>(&local_d0,iVar1);
            std::operator+(&local_130,&local_1d0,&local_d0);
            std::operator+(&local_110,&local_130,"_quads");
            typeToString<int>(&local_f0,iVar2);
            std::operator+(&name,&local_110,&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::~string((string *)&local_170);
            if (bVar8) {
              this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
              deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                        (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                 m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                         &spec,name._M_dataplus._M_p,name._M_dataplus._M_p);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
            }
            std::__cxx11::string::~string((string *)&name);
            std::
            _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ::~_Vector_base(&spec.arrays.
                             super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                           );
          }
        }
      }
    }
  }
  return 3;
}

Assistant:

void SingleVertexArrayFirstTests::init (void)
{
	// Test strides with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_FIXED};
	int					counts[]		= {5, 256};
	int					firsts[]		= {6, 24};
	int					offsets[]		= {1, 16, 17};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
		{
			for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
			{
				for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
				{
					for (int firstNdx = 0; firstNdx < DE_LENGTH_OF_ARRAY(firsts); firstNdx++)
					{
						const int	stride	= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * 2 : strides[strideNdx]);
						const bool	aligned	= ((stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0) && (offsets[offsetNdx] % Array::inputTypeSize(inputTypes[inputTypeNdx]) == 0);

						MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																		Array::OUTPUTTYPE_VEC2,
																		Array::STORAGE_BUFFER,
																		Array::USAGE_DYNAMIC_DRAW,
																		2,
																		offsets[offsetNdx],
																		stride,
																		false,
																		GLValue::getMinValue(inputTypes[inputTypeNdx]),
																		GLValue::getMaxValue(inputTypes[inputTypeNdx]));

						MultiVertexArrayTest::Spec spec;
						spec.primitive	= Array::PRIMITIVE_TRIANGLES;
						spec.drawCount	= counts[countNdx];
						spec.first		= firsts[firstNdx];
						spec.arrays.push_back(arraySpec);

						std::string name = Array::inputTypeToString(inputTypes[inputTypeNdx]) + "_first" + typeToString(firsts[firstNdx]) + "_offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(stride) + "_quads" + typeToString(counts[countNdx]);
						if (aligned)
							addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
					}
				}
			}
		}
	}
}